

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O0

bool __thiscall wabt::WastLexer::ReadLineComment(WastLexer *this)

{
  int iVar1;
  WastLexer *this_local;
  
  do {
    iVar1 = ReadChar(this);
    if (iVar1 == -1) {
      return false;
    }
  } while (iVar1 != 10);
  Newline(this);
  return true;
}

Assistant:

bool WastLexer::ReadLineComment() {
  while (true) {
    switch (ReadChar()) {
      case kEof:
        return false;

      case '\n':
        Newline();
        return true;
    }
  }
}